

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O1

int32_t ecs_column_index_from_name(ecs_iter_t *it,char *name)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  void *pvVar4;
  int32_t unaff_EBX;
  
  if (it->query != (ecs_query_t *)0x0) {
    iVar2 = ecs_vector_count((it->query->sig).columns);
    bVar1 = 0 < iVar2;
    if (0 < iVar2) {
      unaff_EBX = 0;
      do {
        pvVar4 = _ecs_vector_get((it->query->sig).columns,0x28,0x10,unaff_EBX);
        if ((*(char **)((long)pvVar4 + 0x20) != (char *)0x0) &&
           (iVar3 = strcmp(name,*(char **)((long)pvVar4 + 0x20)), iVar3 == 0)) {
          unaff_EBX = unaff_EBX + 1;
          break;
        }
        unaff_EBX = unaff_EBX + 1;
        bVar1 = unaff_EBX < iVar2;
      } while (unaff_EBX != iVar2);
    }
    if (bVar1) {
      return unaff_EBX;
    }
  }
  return 0;
}

Assistant:

int32_t ecs_column_index_from_name(
    const ecs_iter_t *it,
    const char *name)
{
    ecs_sig_column_t *column = NULL;
    if (it->query) {
        int32_t i, count = ecs_vector_count(it->query->sig.columns);
        for (i = 0; i < count; i ++) {
            column = ecs_vector_get(
                it->query->sig.columns, ecs_sig_column_t, i);
            if (column->name) {
                if (!strcmp(name, column->name)) {
                    return i + 1;
                }
            }
        }
    }

    return 0;
}